

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DPolyAction::Destroy(DPolyAction *this)

{
  bool bVar1;
  FPolyObj *pFVar2;
  FPolyObj *poly;
  DPolyAction *this_local;
  
  pFVar2 = PO_GetPolyobj(this->m_PolyObj);
  bVar1 = TObjPtr<DPolyAction>::operator==(&pFVar2->specialdata,this);
  if (bVar1) {
    TObjPtr<DPolyAction>::operator=(&pFVar2->specialdata,(DPolyAction *)0x0);
  }
  StopInterpolation(this);
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DPolyAction::Destroy()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly->specialdata == this)
	{
		poly->specialdata = NULL;
	}

	StopInterpolation();
	Super::Destroy();
}